

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

parser_error parse_pain_message(parser *p)

{
  void *pvVar1;
  char *pcVar2;
  int local_24;
  wchar_t i;
  monster_pain *mp;
  parser *p_local;
  
  pvVar1 = parser_priv(p);
  if (pvVar1 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    local_24 = 0;
    while ((local_24 < 7 && (*(long *)((long)pvVar1 + (long)local_24 * 8) != 0))) {
      local_24 = local_24 + 1;
    }
    if (local_24 == 7) {
      p_local._4_4_ = PARSE_ERROR_TOO_MANY_ENTRIES;
    }
    else {
      pcVar2 = parser_getstr(p,"message");
      pcVar2 = string_make(pcVar2);
      *(char **)((long)pvVar1 + (long)local_24 * 8) = pcVar2;
      p_local._4_4_ = PARSE_ERROR_NONE;
    }
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_pain_message(struct parser *p) {
	struct monster_pain *mp = parser_priv(p);
	int i;

	if (!mp)
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	for (i = 0; i < 7; i++)
		if (!mp->messages[i])
			break;
	if (i == 7)
		return PARSE_ERROR_TOO_MANY_ENTRIES;
	mp->messages[i] = string_make(parser_getstr(p, "message"));
	return PARSE_ERROR_NONE;
}